

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O2

int gdImageColorReplaceThreshold(gdImagePtr im,int src,int dst,float threshold)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  
  iVar4 = 0;
  if (src != dst) {
    lVar2 = (long)im->cy1;
    if (im->trueColor == 0) {
      iVar4 = 0;
      for (; lVar2 <= im->cy2; lVar2 = lVar2 + 1) {
        for (lVar3 = (long)im->cx1; lVar3 <= im->cx2; lVar3 = lVar3 + 1) {
          iVar1 = gdColorMatch(im,src,(uint)im->pixels[lVar2][lVar3],threshold);
          if (iVar1 != 0) {
            gdImageSetPixel(im,(int)lVar3,(int)lVar2,dst);
            iVar4 = iVar4 + 1;
          }
        }
      }
    }
    else {
      iVar4 = 0;
      for (; lVar2 <= im->cy2; lVar2 = lVar2 + 1) {
        for (lVar3 = (long)im->cx1; lVar3 <= im->cx2; lVar3 = lVar3 + 1) {
          iVar1 = gdColorMatch(im,src,im->tpixels[lVar2][lVar3],threshold);
          if (iVar1 != 0) {
            gdImageSetPixel(im,(int)lVar3,(int)lVar2,dst);
            iVar4 = iVar4 + 1;
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

BGD_DECLARE(int) gdImageColorReplaceThreshold (gdImagePtr im, int src, int dst, float threshold)
{
	register int x, y;
	int n = 0;

	if (src == dst) {
		return 0;
	}

#define REPLACING_LOOP(pixel) do {										\
		for (y = im->cy1; y <= im->cy2; y++) {							\
			for (x = im->cx1; x <= im->cx2; x++) {						\
				if (gdColorMatch(im, src, pixel(im, x, y), threshold)) { \
					gdImageSetPixel(im, x, y, dst);						\
					n++;												\
				}														\
			}															\
		}																\
	} while (0)

	if (im->trueColor) {
		REPLACING_LOOP(gdImageTrueColorPixel);
	} else {
		REPLACING_LOOP(gdImagePalettePixel);
	}

#undef REPLACING_LOOP

	return n;
}